

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O1

void __thiscall
dtc::text_input_buffer::parse_error(text_input_buffer *this,char *msg,input_buffer *b,int loc)

{
  int line_end;
  
  if ((-1 < loc) && (loc <= b->size)) {
    parse_error();
    return;
  }
  return;
}

Assistant:

void
text_input_buffer::parse_error(const char *msg,
                               input_buffer &b,
                               int loc)
{
	int line_count = 1;
	int line_start = 0;
	int line_end = loc;
	if (loc < 0 || loc > b.size)
	{
		return;
	}
	for (int i=loc ; i>0 ; --i)
	{
		if (b.buffer[i] == '\n')
		{
			line_count++;
			if (line_start == 0)
			{
				line_start = i+1;
			}
		}
	}
	for (int i=loc+1 ; i<b.size ; ++i)
	{
		if (b.buffer[i] == '\n')
		{
			line_end = i;
			break;
		}
	}
	fprintf(stderr, "Error at %s:%d:%d: %s\n", b.filename().c_str(), line_count, loc - line_start, msg);
	fwrite(&b.buffer[line_start], line_end-line_start, 1, stderr);
	putc('\n', stderr);
	for (int i=0 ; i<(loc-line_start) ; ++i)
	{
		char c = (b.buffer[i+line_start] == '\t') ? '\t' : ' ';
		putc(c, stderr);
	}
	putc('^', stderr);
	putc('\n', stderr);
}